

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignManager.cpp
# Opt level: O3

void __thiscall adios2::core::engine::CampaignManager::Close(CampaignManager *this)

{
  pointer pcVar1;
  string local_40;
  
  if ((this->cmap)._M_h._M_element_count != 0) {
    helper::CreateDirectory(&this->m_CampaignDir);
    pcVar1 = (this->m_Name)._M_dataplus._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + (this->m_Name)._M_string_length);
    CMapToSqlite(&this->cmap,(int)pcVar1,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  this->m_Opened = false;
  return;
}

Assistant:

void CampaignManager::Close()
{
    if (!cmap.empty())
    {
        helper::CreateDirectory(m_CampaignDir);
        CMapToSqlite(cmap, m_WriterRank, m_Name);
    }
    m_Opened = false;
}